

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makedefs.c
# Opt level: O0

void do_dungeon(char *infile,char *outfile)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  uint local_1c;
  int i;
  int rcnt;
  char *outfile_local;
  char *infile_local;
  
  local_1c = 0;
  ifp = (FILE *)fopen(infile,"r");
  if ((FILE *)ifp == (FILE *)0x0) {
    perror(infile);
    exit(1);
  }
  ofp = (FILE *)fopen(outfile,"w+");
  if ((FILE *)ofp == (FILE *)0x0) {
    perror(outfile);
    exit(1);
  }
  fprintf((FILE *)ofp,"%s",Dont_Edit_Data);
LAB_0010a1e3:
  do {
    do {
      pcVar3 = fgets(in_line,0x100,(FILE *)ifp);
      if (pcVar3 == (char *)0x0) {
        fclose((FILE *)ifp);
        fclose((FILE *)ofp);
        return;
      }
      local_1c = local_1c + 1;
    } while (in_line[0] == '#');
    while (in_line[0] == '%') {
      iVar1 = check_control(in_line);
      if (iVar1 < 0) {
        fprintf(_stderr,"Unknown control option \'%s\' in file %s at line %d.\n",in_line,infile,
                (ulong)local_1c);
        exit(1);
      }
      if (deflist[iVar1].true_or_false != '\0') {
        pcVar3 = without_control(in_line);
        fputs(pcVar3,(FILE *)ofp);
        goto LAB_0010a1e3;
      }
      do {
        pcVar3 = fgets(in_line,0x100,(FILE *)ifp);
        if (pcVar3 == (char *)0x0) goto LAB_0010a1e3;
        iVar2 = check_control(in_line);
      } while (iVar2 == iVar1);
    }
    fputs(in_line,(FILE *)ofp);
  } while( true );
}

Assistant:

void do_dungeon(const char *infile, const char *outfile)
{
	int rcnt = 0;

	if (!(ifp = fopen(infile, RDTMODE))) {
		perror(infile);
		exit(EXIT_FAILURE);
	}
	if (!(ofp = fopen(outfile, WRTMODE))) {
		perror(outfile);
		exit(EXIT_FAILURE);
	}
	
	fprintf(ofp, "%s", Dont_Edit_Data);

	while (fgets(in_line, sizeof in_line, ifp) != 0) {
	    rcnt++;
	    if (in_line[0] == '#') continue;	/* discard comments */
recheck:
	    if (in_line[0] == '%') {
		int i = check_control(in_line);
		if (i >= 0) {
		    if (!deflist[i].true_or_false)  {
			while (fgets(in_line, sizeof in_line, ifp) != 0)
			    if (check_control(in_line) != i) goto recheck;
		    } else
			fputs(without_control(in_line),ofp);
		} else {
		    fprintf(stderr, "Unknown control option '%s' in file %s at line %d.\n",
			    in_line, infile, rcnt);
		    exit(EXIT_FAILURE);
		}
	    } else
		fputs(in_line,ofp);
	}
	fclose(ifp);
	fclose(ofp);

	return;
}